

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

void __thiscall slang::ast::LookupResult::clear(LookupResult *this)

{
  size_type sVar1;
  long lVar2;
  pointer __location;
  
  (this->selectors).
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  (this->path).super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  this->found = (Symbol *)0x0;
  this->systemSubroutine = (SystemSubroutine *)0x0;
  *(undefined8 *)((long)&this->systemSubroutine + 5) = 0;
  sVar1 = (this->diagnostics).super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.len;
  if (sVar1 != 0) {
    __location = (this->diagnostics).super_SmallVector<slang::Diagnostic,_2UL>.
                 super_SmallVectorBase<slang::Diagnostic>.data_;
    lVar2 = sVar1 * 0x70;
    do {
      std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                ((__destroy_at_fn *)&std::ranges::destroy_at,__location);
      __location = __location + 1;
      lVar2 = lVar2 + -0x70;
    } while (lVar2 != 0);
  }
  (this->diagnostics).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  return;
}

Assistant:

void LookupResult::clear() {
    found = nullptr;
    systemSubroutine = nullptr;
    upwardCount = 0;
    flags = LookupResultFlags::None;
    selectors.clear();
    path.clear();
    diagnostics.clear();
}